

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.h
# Opt level: O2

Addr * hwnet::Addr::MakeIP4Addr(Addr *__return_storage_ptr__,char *ip,int port)

{
  int iVar1;
  
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 100) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x6c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x54) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x5c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x44) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x4c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x34) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x3c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x24) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x2c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x14) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x1c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0xc) = 0;
  __return_storage_ptr__->family = 0;
  (__return_storage_ptr__->sockaddr).in.sin_family = 2;
  (__return_storage_ptr__->sockaddr).in.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  iVar1 = inet_pton(2,ip,(void *)((long)&__return_storage_ptr__->sockaddr + 4));
  if (-1 < iVar1) {
    __return_storage_ptr__->family = 2;
  }
  __return_storage_ptr__->addrType = (uint)(-1 < iVar1);
  return __return_storage_ptr__;
}

Assistant:

static Addr MakeIP4Addr(const char *ip,int port) {
    	Addr addr;
    	memset(&addr.sockaddr,0,sizeof(addr.sockaddr));
    	addr.sockaddr.in.sin_family = AF_INET;
    	addr.sockaddr.in.sin_port = htons(port);
    	if(inet_pton(AF_INET,ip,&addr.sockaddr.in.sin_addr) < 0) {
    		addr.addrType = SOCK_ADDR_EMPTY;
    	} else {
    		addr.addrType = SOCK_ADDR_IPV4;
    	    addr.family = AF_INET;
        }
    	return addr;
    }